

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int16_suite::fail_array64_int16_missing_three(void)

{
  undefined4 local_4c;
  value local_48 [2];
  undefined1 local_40 [8];
  decoder decoder;
  value_type input [10];
  
  stack0xffffffffffffffee = 0x4da;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[10]>
            ((decoder *)local_40,(uchar (*) [10])((long)&decoder.current.view._M_str + 6));
  local_48[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_4c = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x7e2,"void compact_int16_suite::fail_array64_int16_missing_three()",local_48,
             &local_4c);
  return;
}

Assistant:

void fail_array64_int16_missing_three()
{
    const value_type input[] = { token::code::array64_int16, 0x04, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x12 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}